

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nstime.c
# Opt level: O2

void nstime_update_impl(nstime_t *time)

{
  ulong uVar1;
  
  uVar1 = time->ns;
  nstime_get(time);
  if (time->ns < uVar1) {
    time->ns = uVar1;
  }
  return;
}

Assistant:

static void
nstime_update_impl(nstime_t *time) {
	nstime_t old_time;

	nstime_copy(&old_time, time);
	nstime_get(time);

	/* Handle non-monotonic clocks. */
	if (unlikely(nstime_compare(&old_time, time) > 0)) {
		nstime_copy(time, &old_time);
	}
}